

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_0::PolysTestGroup::init
          (PolysTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int i;
  int extraout_EAX;
  long lVar1;
  TriangleCaseBase *pTVar2;
  TriangleData viewportPolys [4];
  TriangleData largeDepthPolys [3];
  TriangleData largePolys [3];
  TriangleData attribPolys [4];
  TriangleData depthPolys [4];
  undefined1 local_828 [16];
  undefined8 local_818;
  undefined1 *puStack_810;
  float local_808 [4];
  undefined1 *local_7f8;
  undefined1 *puStack_7f0;
  float local_7e8 [4];
  undefined1 *local_7d8;
  undefined1 *puStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined1 *local_7b8;
  undefined1 *puStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined1 *local_798;
  undefined1 *puStack_790;
  undefined1 *local_788;
  undefined8 uStack_780;
  undefined1 *local_778;
  undefined1 *puStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined1 *local_758;
  undefined1 *puStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined1 *local_738;
  undefined1 *puStack_730;
  undefined1 *local_728;
  undefined8 uStack_720;
  undefined1 *local_718;
  undefined1 *puStack_710;
  undefined1 local_708 [16];
  undefined8 local_6f8;
  undefined1 *puStack_6f0;
  float local_6e8 [4];
  undefined1 *local_6d8;
  undefined1 *puStack_6d0;
  float local_6c8 [4];
  undefined1 *local_6b8;
  undefined1 *puStack_6b0;
  undefined1 local_6a8 [16];
  undefined8 local_698;
  float afStack_690 [6];
  undefined1 *local_678;
  float afStack_670 [2];
  undefined1 *local_668;
  float afStack_660 [2];
  undefined1 *local_658;
  undefined1 *puStack_650;
  undefined1 local_648 [56];
  float afStack_610 [8];
  undefined1 *puStack_5f0;
  undefined1 local_5e8 [56];
  float afStack_5b0 [8];
  undefined1 *puStack_590;
  undefined1 local_588 [24];
  float afStack_570 [2];
  undefined1 *local_568;
  undefined1 *puStack_560;
  float local_558 [4];
  undefined1 *local_548;
  undefined1 *puStack_540;
  float local_538 [4];
  undefined1 *local_528;
  undefined1 *puStack_520;
  undefined1 *local_518;
  undefined8 uStack_510;
  undefined1 *local_508;
  undefined1 *puStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined1 *local_4e8;
  undefined1 *puStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined1 *local_4c8;
  undefined1 *puStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined1 *local_4a8;
  undefined1 *puStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 *local_488;
  undefined1 *puStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined1 *local_468;
  undefined1 *puStack_460;
  undefined1 local_458 [24];
  undefined1 *puStack_440;
  float local_438 [4];
  undefined1 *local_428;
  undefined1 *puStack_420;
  float local_418 [4];
  undefined1 *local_408;
  undefined1 *puStack_400;
  undefined1 *local_3f8;
  undefined8 uStack_3f0;
  undefined1 *local_3e8;
  undefined1 *puStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined1 *local_3c8;
  undefined1 *puStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 *local_3a8;
  undefined1 *puStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 *local_388;
  undefined1 *puStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 *local_368;
  undefined1 *puStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined1 *local_348;
  undefined1 *puStack_340;
  undefined1 local_338 [56];
  float afStack_300 [8];
  undefined1 *puStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined1 *local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined1 *puStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 *local_248;
  undefined8 uStack_240;
  float local_238 [6];
  undefined1 *puStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 *local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined1 *puStack_1c0;
  undefined1 local_1b8 [24];
  undefined1 *puStack_1a0;
  float local_198 [4];
  undefined1 *local_188;
  undefined1 *puStack_180;
  float local_178 [4];
  undefined1 *local_168;
  undefined1 *puStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  
  local_828._0_4_ = -0.8;
  local_828._4_4_ = -0.2;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818 = &DAT_3f8000003f800000;
  puStack_810 = &DAT_3f8000003f800000;
  local_808[0] = -0.8;
  local_808[1] = 0.2;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = &DAT_3f8000003f800000;
  local_7e8[0] = -1.3;
  local_7e8[1] = 0.05;
  local_7e8[2] = 0.0;
  local_7e8[3] = 1.0;
  local_7d8 = &DAT_3f8000003f800000;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf99999abf19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = &DAT_3f8000003f800000;
  puStack_7b0 = &DAT_3f8000003f800000;
  local_7a8 = 0xbf19999abf99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = &DAT_3f8000003f800000;
  local_788 = (undefined1 *)0xbf19999abf19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = &DAT_3f8000003f800000;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f19999abf8ccccd;
  uStack_760 = 0x3f80000000000000;
  local_758 = &DAT_3f8000003f800000;
  puStack_750 = &DAT_3f8000003f800000;
  local_748 = 0x3f8ccccdbf8ccccd;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = &DAT_3f8000003f800000;
  local_728 = (undefined1 *)0x3f8ccccdbf19999a;
  uStack_720 = 0x3f80000000000000;
  local_718 = &DAT_3f8000003f800000;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = 0.8;
  local_708._4_4_ = 1.1;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8 = &DAT_3f8000003f800000;
  puStack_6f0 = &DAT_3f8000003f800000;
  local_6e8[0] = 0.95;
  local_6e8[1] = -1.1;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = &DAT_3f8000003f800000;
  local_6c8[0] = 3.0;
  local_6c8[1] = 0.0;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = &DAT_3f8000003f800000;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_1b8._0_4_ = -0.2;
  local_1b8._4_4_ = 0.7;
  local_1b8._8_4_ = 0.0;
  local_1b8._12_4_ = 1.0;
  local_1b8._16_8_ = &DAT_3f8000003f800000;
  puStack_1a0 = &DAT_3f8000003f800000;
  local_198[0] = 0.2;
  local_198[1] = 0.7;
  local_198[2] = 0.0;
  local_198[3] = 1.0;
  local_188 = &DAT_3f8000003f800000;
  puStack_180 = &DAT_3f8000003f800000;
  local_178[0] = 0.0;
  local_178[1] = 0.9;
  local_178[2] = 2.0;
  local_178[3] = 1.0;
  local_168 = &DAT_3f8000003f800000;
  puStack_160 = &DAT_3f8000003f800000;
  local_158 = 0x3ecccccd3f666666;
  uStack_150 = 0x3f800000bfc00000;
  local_148 = &DAT_3f8000003f800000;
  puStack_140 = &DAT_3f8000003f800000;
  local_138 = 0xbecccccd3f666666;
  uStack_130 = 0x3f800000bfc00000;
  local_128 = &DAT_3f8000003f800000;
  puStack_120 = &DAT_3f8000003f800000;
  local_118 = 0x3f19999a;
  uStack_110 = 0x3f80000000000000;
  local_108 = &DAT_3f8000003f800000;
  puStack_100 = &DAT_3f8000003f800000;
  local_f8 = 0x3f19999abf666666;
  uStack_f0 = 0x3f800000c0000000;
  local_e8 = &DAT_3f8000003f800000;
  puStack_e0 = &DAT_3f8000003f800000;
  local_d8 = 0xbf19999abf666666;
  uStack_d0 = 0x3f800000c0000000;
  local_c8 = &DAT_3f8000003f800000;
  puStack_c0 = &DAT_3f8000003f800000;
  local_b8 = 0xbecccccd;
  uStack_b0 = 0x3f80000040000000;
  local_a8 = &DAT_3f8000003f800000;
  puStack_a0 = &DAT_3f8000003f800000;
  local_98 = 0xbf99999a00000000;
  uStack_90 = 0x3f80000000000000;
  local_88 = &DAT_3f8000003f800000;
  puStack_80 = &DAT_3f8000003f800000;
  local_78 = 0x3f00000000000000;
  uStack_70 = 0x3f800000bfc00000;
  local_68 = &DAT_3f8000003f800000;
  puStack_60 = &DAT_3f8000003f800000;
  local_58 = 0xbf6666663f99999a;
  uStack_50 = 0x3f80000000000000;
  local_48 = &DAT_3f8000003f800000;
  puStack_40 = &DAT_3f8000003f800000;
  local_458._0_4_ = -0.2;
  local_458._4_4_ = -0.3;
  local_458._8_4_ = 0.0;
  local_458._12_4_ = 1.0;
  local_458._16_8_ = &DAT_3f8000003f800000;
  puStack_440 = &DAT_3f8000003f800000;
  local_438[0] = 0.2;
  local_438[1] = -0.3;
  local_438[2] = 0.0;
  local_438[3] = 1.0;
  local_428 = &DAT_3f8000003f800000;
  puStack_420 = &DAT_3f8000003f800000;
  local_418[0] = 0.0;
  local_418[1] = -100000.0;
  local_418[2] = 2.0;
  local_418[3] = 1.0;
  local_408 = &DAT_3f8000003f800000;
  puStack_400 = &DAT_3f8000003f800000;
  local_3f8 = &DAT_3f0000003f000000;
  uStack_3f0 = 0x3f80000000000000;
  local_3e8 = &DAT_3f8000003f800000;
  puStack_3e0 = &DAT_3f8000003f800000;
  local_3d8 = 0x3f00000047c35000;
  uStack_3d0 = 0x3f80000000000000;
  local_3c8 = &DAT_3f8000003f800000;
  puStack_3c0 = &DAT_3f8000003f800000;
  local_3b8 = 0x47c350003f000000;
  uStack_3b0 = 0x3f80000000000000;
  local_3a8 = &DAT_3f8000003f800000;
  puStack_3a0 = &DAT_3f8000003f800000;
  local_398 = 0xc7c35000bf666666;
  uStack_390 = 0x3f80000000000000;
  local_388 = &DAT_3f8000003f800000;
  puStack_380 = &DAT_3f8000003f800000;
  local_378 = 0xc7c35000bf8ccccd;
  uStack_370 = 0x3f80000000000000;
  local_368 = &DAT_3f8000003f800000;
  puStack_360 = &DAT_3f8000003f800000;
  local_358 = 0x47c35000bf666666;
  uStack_350 = 0x3f80000000000000;
  local_348 = &DAT_3f8000003f800000;
  puStack_340 = &DAT_3f8000003f800000;
  local_588._16_4_ = -0.2;
  local_588._20_4_ = -0.3;
  afStack_570[0] = 0.0;
  afStack_570[1] = 1.0;
  local_568 = &DAT_3f8000003f800000;
  puStack_560 = &DAT_3f8000003f800000;
  local_558[0] = 0.2;
  local_558[1] = -0.3;
  local_558[2] = 0.0;
  local_558[3] = 1.0;
  local_548 = &DAT_3f8000003f800000;
  puStack_540 = &DAT_3f8000003f800000;
  local_538[0] = 0.0;
  local_538[1] = -100000.0;
  local_538[2] = 100000.0;
  local_538[3] = 1.0;
  local_528 = &DAT_3f8000003f800000;
  puStack_520 = &DAT_3f8000003f800000;
  local_518 = &DAT_3f0000003f000000;
  uStack_510 = 0x3f80000000000000;
  local_508 = &DAT_3f8000003f800000;
  puStack_500 = &DAT_3f8000003f800000;
  local_4f8 = 0x474350003f666666;
  uStack_4f0 = 0x3f800000c7c35000;
  local_4e8 = &DAT_3f8000003f800000;
  puStack_4e0 = &DAT_3f8000003f800000;
  local_4d8 = 0x46c35000;
  uStack_4d0 = 0x3f800000c7c35000;
  local_4c8 = &DAT_3f8000003f800000;
  puStack_4c0 = &DAT_3f8000003f800000;
  local_338._0_4_ = -0.2;
  local_338._4_4_ = -0.3;
  local_338._8_4_ = 0.0;
  local_338._12_4_ = 1.0;
  local_338._16_4_ = 1.0;
  local_338._20_4_ = 0.0;
  local_338._24_4_ = 0.0;
  local_338._28_4_ = 1.0;
  local_338._32_4_ = 0.2;
  local_338._36_4_ = -0.3;
  local_338._40_4_ = 0.0;
  local_338._44_4_ = 1.0;
  local_338._48_8_ = &DAT_3f8000003f800000;
  afStack_300[0] = 0.0;
  afStack_300[1] = 1.0;
  afStack_300[2] = 0.0;
  afStack_300[3] = -100000.0;
  afStack_300[4] = 2.0;
  afStack_300[5] = 1.0;
  afStack_300[6] = 0.0;
  afStack_300[7] = 0.0;
  puStack_2e0 = &DAT_3f8000003f800000;
  local_2d8 = 0x3f99999a3f19999a;
  uStack_2d0 = 0x3f80000000000000;
  local_2c8 = 0x3f800000;
  uStack_2c0 = 0x3f80000000000000;
  local_2b8 = 0x3f19999a3f99999a;
  uStack_2b0 = 0x3f80000000000000;
  local_2a8 = &DAT_3f8000003f800000;
  uStack_2a0 = 0x3f80000000000000;
  local_298 = 0x3f19999a3f19999a;
  uStack_290 = 0x3f80000000000000;
  local_288 = 0;
  puStack_280 = &DAT_3f8000003f800000;
  local_278 = 0xbf99999a3f19999a;
  uStack_270 = 0x3f80000000000000;
  local_268 = 0x3f800000;
  uStack_260 = 0x3f80000000000000;
  local_258 = 0xbf19999a3f99999a;
  uStack_250 = 0x3f80000000000000;
  local_248 = &DAT_3f8000003f800000;
  uStack_240 = 0x3f80000000000000;
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  local_238[2] = 0.0;
  local_238[3] = 0.0;
  local_4b8 = 0x46c35000bf666666;
  uStack_4b0 = 0x3f80000047c35000;
  local_4a8 = &DAT_3f8000003f800000;
  puStack_4a0 = &DAT_3f8000003f800000;
  local_498 = 0xc6c35000bf000000;
  uStack_490 = 0x3f800000c7c35000;
  local_488 = &DAT_3f8000003f800000;
  puStack_480 = &DAT_3f8000003f800000;
  local_478 = 0x46c35000be4ccccd;
  uStack_470 = 0x3f80000047c35000;
  local_468 = &DAT_3f8000003f800000;
  puStack_460 = &DAT_3f8000003f800000;
  local_588._0_4_ = 0.6;
  local_588._4_4_ = -0.6;
  local_588._8_4_ = 0.0;
  local_588._12_4_ = 1.0;
  lVar1 = 0;
  do {
    local_238[lVar1] = *(float *)(local_588 + lVar1 * 4) * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_238[4] = 0.0;
  local_238[5] = 0.0;
  puStack_220 = &DAT_3f8000003f800000;
  local_218 = 0x46c35000bf666666;
  uStack_210 = 0x3f80000047c35000;
  local_208 = 0x3f800000;
  uStack_200 = 0x3f80000000000000;
  local_1f8 = 0xc6c35000bf000000;
  uStack_1f0 = 0x3f800000c7c35000;
  local_1e8 = &DAT_3f8000003f800000;
  uStack_1e0 = 0x3f80000000000000;
  local_1d8 = 0x46c35000be4ccccd;
  uStack_1d0 = 0x3f80000047c35000;
  local_1c8 = 0;
  puStack_1c0 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_clip_viewport_center",
             "polygon viewport clipping",(TriangleData *)local_828,(TriangleData *)local_6a8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_clip_viewport_corner",
             "polygon viewport clipping",(TriangleData *)local_828,(TriangleData *)local_6a8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_z_clip","polygon z clipping",
             (TriangleData *)local_1b8,(TriangleData *)&stack0xffffffffffffffc8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_z_clip_viewport_center",
             "polygon z clipping",(TriangleData *)local_1b8,(TriangleData *)&stack0xffffffffffffffc8
             ,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_z_clip_viewport_corner",
             "polygon z clipping",(TriangleData *)local_1b8,(TriangleData *)&stack0xffffffffffffffc8
             ,(WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"large_poly_clip_viewport_center",
             "polygon viewport clipping",(TriangleData *)local_458,(TriangleData *)local_338,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"large_poly_clip_viewport_corner",
             "polygon viewport clipping",(TriangleData *)local_458,(TriangleData *)local_338,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"large_poly_z_clip","polygon z clipping",
             (TriangleData *)(local_588 + 0x10),(TriangleData *)local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"large_poly_z_clip_viewport_center",
             "polygon z clipping",(TriangleData *)(local_588 + 0x10),(TriangleData *)local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"large_poly_z_clip_viewport_corner",
             "polygon z clipping",(TriangleData *)(local_588 + 0x10),(TriangleData *)local_458,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_attrib_clip","polygon clipping",
             (TriangleData *)local_338,(TriangleData *)local_1b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_attrib_clip_viewport_center",
             "polygon clipping",(TriangleData *)local_338,(TriangleData *)local_1b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"poly_attrib_clip_viewport_corner",
             "polygon clipping",(TriangleData *)local_338,(TriangleData *)local_1b8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0x3f99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0x3f19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0x3f19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0xbf99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0xbf19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_1b8._0_4_ = 0.6;
  local_1b8._4_4_ = -0.6;
  local_1b8._8_4_ = 0.0;
  local_1b8._12_4_ = 1.0;
  local_728 = (undefined1 *)0x0;
  uStack_720 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_728 + lVar1 * 4) = *(float *)(local_1b8 + lVar1 * 4) * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = 0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = 1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_338._0_4_ = 0.6;
  local_338._4_4_ = 0.6;
  local_338._8_4_ = 0.0;
  local_338._12_4_ = 1.0;
  local_6c8[0] = 0.0;
  local_6c8[1] = 0.0;
  local_6c8[2] = 0.0;
  local_6c8[3] = 0.0;
  lVar1 = 0;
  do {
    local_6c8[lVar1] = *(float *)(local_338 + lVar1 * 4) * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = 1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = 0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_458._0_4_ = -0.6;
  local_458._4_4_ = 0.6;
  local_458._8_4_ = 0.0;
  local_458._12_4_ = 1.0;
  local_668 = (undefined1 *)0x0;
  afStack_660[0] = 0.0;
  afStack_660[1] = 0.0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_668 + lVar1 * 4) = *(float *)(local_458 + lVar1 * 4) * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  local_648._0_4_ = -0.6;
  local_648._4_4_ = -1.2;
  local_648._8_4_ = 0.0;
  local_648._12_4_ = 1.0;
  local_648._16_4_ = 1.0;
  local_648._20_4_ = 0.0;
  local_648._24_4_ = 0.0;
  local_648._28_4_ = 1.0;
  local_648._32_4_ = -1.2;
  local_648._36_4_ = -0.6;
  local_648._40_4_ = 0.0;
  local_648._44_4_ = 1.0;
  local_648._48_8_ = &DAT_3f8000003f800000;
  afStack_610[0] = 0.0;
  afStack_610[1] = 1.0;
  local_588._16_4_ = -0.6;
  local_588._20_4_ = -0.6;
  afStack_570[0] = 0.0;
  afStack_570[1] = 1.0;
  afStack_610[2] = 0.0;
  afStack_610[3] = 0.0;
  afStack_610[4] = 0.0;
  afStack_610[5] = 0.0;
  lVar1 = 0;
  do {
    afStack_610[lVar1 + 2] = afStack_570[lVar1 + -2] * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  afStack_610[6] = 0.0;
  afStack_610[7] = 0.0;
  puStack_5f0 = &DAT_3f8000003f800000;
  local_5e8._0_4_ = -0.9;
  local_5e8._4_4_ = 0.225;
  local_5e8._8_4_ = 0.9;
  local_5e8._12_4_ = 1.0;
  local_5e8._16_4_ = 1.0;
  local_5e8._20_4_ = 0.0;
  local_5e8._24_4_ = 0.0;
  local_5e8._28_4_ = 1.0;
  local_5e8._32_4_ = -0.5;
  local_5e8._36_4_ = -0.225;
  local_5e8._40_4_ = -0.9;
  local_5e8._44_4_ = 1.0;
  local_5e8._48_8_ = &DAT_3f8000003f800000;
  afStack_5b0[0] = 0.0;
  afStack_5b0[1] = 1.0;
  afStack_5b0[2] = -0.2;
  afStack_5b0[3] = 0.225;
  afStack_5b0[4] = 0.9;
  afStack_5b0[5] = 1.0;
  afStack_5b0[6] = 0.0;
  afStack_5b0[7] = 0.0;
  puStack_590 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_0","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_588,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_0_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_588,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_0_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_588,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0x3f99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0x3f19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0x3f19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0xbf99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0xbf19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_1b8._0_4_ = 0.6;
  local_1b8._4_4_ = -0.6;
  local_1b8._8_4_ = 0.0;
  local_1b8._12_4_ = 1.0;
  local_728 = (undefined1 *)0x0;
  uStack_720 = 0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_728 + lVar1 * 4) = *(float *)(local_1b8 + lVar1 * 4) * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = 0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = 1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_338._0_4_ = 0.6;
  local_338._4_4_ = 0.6;
  local_338._8_4_ = 0.0;
  local_338._12_4_ = 1.0;
  local_6c8[0] = 0.0;
  local_6c8[1] = 0.0;
  local_6c8[2] = 0.0;
  local_6c8[3] = 0.0;
  lVar1 = 0;
  do {
    local_6c8[lVar1] = *(float *)(local_338 + lVar1 * 4) * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = 1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = 0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_458._0_4_ = -0.6;
  local_458._4_4_ = 0.6;
  local_458._8_4_ = 0.0;
  local_458._12_4_ = 1.0;
  local_668 = (undefined1 *)0x0;
  afStack_660[0] = 0.0;
  afStack_660[1] = 0.0;
  lVar1 = 0;
  do {
    *(float *)((long)&local_668 + lVar1 * 4) = *(float *)(local_458 + lVar1 * 4) * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  local_648._0_4_ = -0.6;
  local_648._4_4_ = -1.2;
  local_648._8_4_ = 0.0;
  local_648._12_4_ = 1.0;
  local_648._16_4_ = 1.0;
  local_648._20_4_ = 0.0;
  local_648._24_4_ = 0.0;
  local_648._28_4_ = 1.0;
  local_648._32_4_ = -1.2;
  local_648._36_4_ = -0.6;
  local_648._40_4_ = 0.0;
  local_648._44_4_ = 1.0;
  local_648._48_8_ = &DAT_3f8000003f800000;
  afStack_610[0] = 0.0;
  afStack_610[1] = 1.0;
  local_588._16_4_ = -0.6;
  local_588._20_4_ = -0.6;
  afStack_570[0] = 0.0;
  afStack_570[1] = 1.0;
  afStack_610[2] = 0.0;
  afStack_610[3] = 0.0;
  afStack_610[4] = 0.0;
  afStack_610[5] = 0.0;
  lVar1 = 0;
  do {
    afStack_610[lVar1 + 2] = afStack_570[lVar1 + -2] * 16.0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  afStack_610[6] = 0.0;
  afStack_610[7] = 0.0;
  puStack_5f0 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_1","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_5e8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_1_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_5e8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_1_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_5e8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0x3f99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0x3f19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0x3f19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0xbf99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0xbf19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = (undefined1 *)0xbf19999a3f19999a;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = 0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = 1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_6c8[0] = 0.6;
  local_6c8[1] = 0.6;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = 1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = 0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_668 = (undefined1 *)0x3f19999abf19999a;
  afStack_660[0] = 0.0;
  afStack_660[1] = 1.0;
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  local_648._0_4_ = -0.6;
  local_648._4_4_ = -1.2;
  local_648._8_4_ = 0.0;
  local_648._12_4_ = 1.0;
  local_648._16_4_ = 1.0;
  local_648._20_4_ = 0.0;
  local_648._24_4_ = 0.0;
  local_648._28_4_ = 1.0;
  local_648._32_4_ = -1.2;
  local_648._36_4_ = -0.6;
  local_648._40_4_ = 0.0;
  local_648._44_4_ = 1.0;
  local_648._48_8_ = &DAT_3f8000003f800000;
  afStack_610[0] = 0.0;
  afStack_610[1] = 1.0;
  afStack_610[2] = -0.6;
  afStack_610[3] = -0.6;
  afStack_610[4] = 0.0;
  afStack_610[5] = 1.0;
  afStack_610[6] = 0.0;
  afStack_610[7] = 0.0;
  puStack_5f0 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_2","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_5e8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_2_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_5e8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_2_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_5e8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = -2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0xbf19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0xbf19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0x3f19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = (undefined1 *)0x3f19999a3f19999a;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = -0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = -1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_6c8[0] = -0.6;
  local_6c8[1] = 0.6;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = -1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = -0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_668 = (undefined1 *)0xbf19999abf19999a;
  afStack_660[0] = 0.0;
  afStack_660[1] = 1.0;
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_3","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_3_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_3_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = 0.3;
  local_828._4_4_ = 0.2;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.3;
  local_808[1] = -0.2;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.9;
  local_7e8[1] = 0.0;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0xbf19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0xbf19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0x3f19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = (undefined1 *)0x3f19999a3f19999a;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = -0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = -1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_6c8[0] = -0.6;
  local_6c8[1] = 0.6;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = -1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = -0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_668 = (undefined1 *)0xbf19999abf19999a;
  afStack_660[0] = 0.0;
  afStack_660[1] = 1.0;
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_4","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_4_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_4_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.3;
  local_828._4_4_ = 0.2;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = -0.3;
  local_808[1] = -0.2;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = -0.9;
  local_7e8[1] = 0.0;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0xbf19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0xbf19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0x3f19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = (undefined1 *)0x3f19999a3f19999a;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = -0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = -1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_6c8[0] = -0.6;
  local_6c8[1] = 0.6;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = -1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = -0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_668 = (undefined1 *)0xbf19999abf19999a;
  afStack_660[0] = 0.0;
  afStack_660[1] = 1.0;
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_5","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_5_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_5_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = 0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = 0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = 0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0xbf19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0xbf19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0x3f19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = (undefined1 *)0x3f19999a3f19999a;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = -0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = -1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_6c8[0] = -0.6;
  local_6c8[1] = 0.6;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = -1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = -0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_668 = (undefined1 *)0xbf19999abf19999a;
  afStack_660[0] = 0.0;
  afStack_660[1] = 1.0;
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_6","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_6_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_6_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = 0.6;
  local_828._4_4_ = 1.2;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 1.2;
  local_808[1] = 0.6;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.6;
  local_7e8[1] = 0.6;
  local_7e8[2] = 0.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf99999a3f19999a;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0xbf19999a3f99999a;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = (undefined1 *)0xbf19999a3f19999a;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x0;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f99999a3f19999a;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0x3f19999a3f99999a;
  uStack_740 = 0x3f80000000000000;
  local_738 = &DAT_3f8000003f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = (undefined1 *)0x3f19999a3f19999a;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  local_708._0_4_ = -0.6;
  local_708._4_4_ = 1.2;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 1.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = (undefined1 *)0x3f80000000000000;
  local_6e8[0] = -1.2;
  local_6e8[1] = 0.6;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = &DAT_3f8000003f800000;
  puStack_6d0 = (undefined1 *)0x3f80000000000000;
  local_6c8[0] = -0.6;
  local_6c8[1] = 0.6;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -0.6;
  local_6a8._4_4_ = -1.2;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698._0_4_ = 1.0;
  local_698._4_4_ = 0.0;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = -1.2;
  afStack_690[3] = -0.6;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_668 = (undefined1 *)0xbf19999abf19999a;
  afStack_660[0] = 0.0;
  afStack_660[1] = 1.0;
  local_658 = (undefined1 *)0x0;
  puStack_650 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_7","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_7_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_7_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf800000bf800000;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = &DAT_3f8000003f800000;
  puStack_7b0 = &DAT_3f8000003f800000;
  local_7a8 = 0xbf8000003f800000;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = &DAT_3f8000003f800000;
  local_788 = (undefined1 *)0x3f800000bf800000;
  uStack_780 = 0x3f80000000000000;
  local_778 = &DAT_3f8000003f800000;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f800000bf800000;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x0;
  puStack_750 = &DAT_3f8000003f800000;
  local_748 = 0xbf8000003f800000;
  uStack_740 = 0x3f80000000000000;
  local_738 = (undefined1 *)0x0;
  puStack_730 = &DAT_3f8000003f800000;
  local_728 = &DAT_3f8000003f800000;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_8","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_708,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_8_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_708,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_8_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_708,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0x3f800000bf800000;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = (undefined1 *)0x3f800000;
  puStack_7b0 = (undefined1 *)0x3f80000000000000;
  local_7a8 = 0xbf8000003f800000;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = (undefined1 *)0x3f800000;
  puStack_790 = (undefined1 *)0x3f80000000000000;
  local_788 = &DAT_3f8000003f800000;
  uStack_780 = 0x3f80000000000000;
  local_778 = (undefined1 *)0x3f800000;
  puStack_770 = (undefined1 *)0x3f80000000000000;
  local_768 = 0xbf800000bf800000;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x0;
  puStack_750 = &DAT_3f8000003f800000;
  local_748 = 0xbf8000003f800000;
  uStack_740 = 0x3f80000000000000;
  local_738 = (undefined1 *)0x0;
  puStack_730 = &DAT_3f8000003f800000;
  local_728 = (undefined1 *)0x3f800000bf800000;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x0;
  puStack_710 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_9","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_708,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_9_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_708,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_9_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_708,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf800000bf800000;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = &DAT_3f8000003f800000;
  puStack_7b0 = &DAT_3f8000003f800000;
  local_7a8 = 0xbf8000003f800000;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = &DAT_3f8000003f800000;
  local_788 = (undefined1 *)0x3f800000bf800000;
  uStack_780 = 0x3f80000000000000;
  local_778 = &DAT_3f8000003f800000;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f800000bf800000;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0xbf8000003f800000;
  uStack_740 = 0x3f80000000000000;
  local_738 = (undefined1 *)0x3f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = &DAT_3f8000003f800000;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x3f800000;
  puStack_710 = (undefined1 *)0x3f80000000000000;
  local_708._0_4_ = -1.0;
  local_708._4_4_ = -1.0;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 0.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = &DAT_3f8000003f800000;
  local_6e8[0] = 1.0;
  local_6e8[1] = -1.0;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = (undefined1 *)0x0;
  puStack_6d0 = &DAT_3f8000003f800000;
  local_6c8[0] = -1.0;
  local_6c8[1] = 1.0;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_10","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_6a8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_10_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_6a8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_10_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_6a8,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  local_828._0_4_ = -0.2;
  local_828._4_4_ = -0.3;
  local_828._8_4_ = 0.0;
  local_828._12_4_ = 1.0;
  local_818._0_4_ = 1.0;
  local_818._4_4_ = 0.0;
  puStack_810 = (undefined1 *)0x3f80000000000000;
  local_808[0] = 0.2;
  local_808[1] = -0.3;
  local_808[2] = 0.0;
  local_808[3] = 1.0;
  local_7f8 = &DAT_3f8000003f800000;
  puStack_7f0 = (undefined1 *)0x3f80000000000000;
  local_7e8[0] = 0.0;
  local_7e8[1] = -0.9;
  local_7e8[2] = 2.0;
  local_7e8[3] = 1.0;
  local_7d8 = (undefined1 *)0x0;
  puStack_7d0 = &DAT_3f8000003f800000;
  local_7c8 = 0xbf800000bf800000;
  uStack_7c0 = 0x3f80000000000000;
  local_7b8 = &DAT_3f8000003f800000;
  puStack_7b0 = &DAT_3f8000003f800000;
  local_7a8 = 0xbf8000003f800000;
  uStack_7a0 = 0x3f80000000000000;
  local_798 = &DAT_3f8000003f800000;
  puStack_790 = &DAT_3f8000003f800000;
  local_788 = (undefined1 *)0x3f800000bf800000;
  uStack_780 = 0x3f80000000000000;
  local_778 = &DAT_3f8000003f800000;
  puStack_770 = &DAT_3f8000003f800000;
  local_768 = 0x3f800000bf800000;
  uStack_760 = 0x3f80000000000000;
  local_758 = (undefined1 *)0x3f800000;
  puStack_750 = (undefined1 *)0x3f80000000000000;
  local_748 = 0xbf8000003f800000;
  uStack_740 = 0x3f80000000000000;
  local_738 = (undefined1 *)0x3f800000;
  puStack_730 = (undefined1 *)0x3f80000000000000;
  local_728 = &DAT_3f8000003f800000;
  uStack_720 = 0x3f80000000000000;
  local_718 = (undefined1 *)0x3f800000;
  puStack_710 = (undefined1 *)0x3f80000000000000;
  local_708._0_4_ = -1.0;
  local_708._4_4_ = -1.0;
  local_708._8_4_ = 0.0;
  local_708._12_4_ = 1.0;
  local_6f8._0_4_ = 0.0;
  local_6f8._4_4_ = 0.0;
  puStack_6f0 = &DAT_3f8000003f800000;
  local_6e8[0] = 1.0;
  local_6e8[1] = -1.0;
  local_6e8[2] = 0.0;
  local_6e8[3] = 1.0;
  local_6d8 = (undefined1 *)0x0;
  puStack_6d0 = &DAT_3f8000003f800000;
  local_6c8[0] = -1.0;
  local_6c8[1] = 1.0;
  local_6c8[2] = 0.0;
  local_6c8[3] = 1.0;
  local_6b8 = (undefined1 *)0x0;
  puStack_6b0 = &DAT_3f8000003f800000;
  local_6a8._0_4_ = -1.0;
  local_6a8._4_4_ = 1.0;
  local_6a8._8_4_ = 0.0;
  local_6a8._12_4_ = 1.0;
  local_698 = &DAT_3f8000003f800000;
  afStack_690[0] = 0.0;
  afStack_690[1] = 1.0;
  afStack_690[2] = 1.0;
  afStack_690[3] = -1.0;
  afStack_690[4] = 0.0;
  afStack_690[5] = 1.0;
  local_678 = &DAT_3f8000003f800000;
  afStack_670[0] = 0.0;
  afStack_670[1] = 1.0;
  local_668 = &DAT_3f8000003f800000;
  afStack_660[0] = 0.0;
  afStack_660[1] = 1.0;
  local_658 = &DAT_3f8000003f800000;
  puStack_650 = (undefined1 *)0x3f80000000000000;
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_11","polygon clipping",
             (TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_WHOLE);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_11_viewport_center",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CENTER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar2 = (TriangleCaseBase *)operator_new(0xa0);
  TriangleCaseBase::TriangleCaseBase
            (pTVar2,(this->super_TestCaseGroup).m_context,"multiple_11_viewport_corner",
             "polygon clipping",(TriangleData *)local_828,(TriangleData *)local_648,
             (WindowRectangle *)Functional::(anonymous_namespace)::VIEWPORT_CORNER);
  (pTVar2->super_RenderTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TriangleCaseBase_0218c500;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  return extraout_EAX;
}

Assistant:

void PolysTestGroup::init (void)
{
	const float		large = 100000.0f;
	const float		offset = 0.9f;
	const tcu::Vec4 white	(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red		(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue	(0.0f, 0.0f, 1.0f, 1.0f);

	// basic cases
	{
		const TriangleCase::TriangleData viewportPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.8f, -0.2f,  0.0f,  1.0f), white, tcu::Vec4(-0.8f,  0.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.3f,  0.05f,  0.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-1.1f,  0.6f,  0.0f,  1.0f), white, tcu::Vec4(-1.1f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4(-0.6f,  1.1f,  0.0f,  1.0f), white},
			{tcu::Vec4( 0.8f,  1.1f,  0.0f,  1.0f), white, tcu::Vec4( 0.95f,-1.1f,  0.0f,  1.0f), white, tcu::Vec4( 3.0f,  0.0f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData depthPolys[] =
		{
			// one vertex clipped to Z+
			{tcu::Vec4(-0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f,  0.7f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.9f,  2.0f,  1.0f), white},

			// two vertices clipped to Z-
			{tcu::Vec4( 0.9f, 0.4f,  -1.5f,  1.0f), white, tcu::Vec4( 0.9f, -0.4f, -1.5f,  1.0f), white, tcu::Vec4( 0.6f,  0.0f,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, 0.6f,  -2.0f,  1.0f), white, tcu::Vec4(-0.9f, -0.6f, -2.0f,  1.0f), white, tcu::Vec4(-0.4f,  0.0f,  2.0f,  1.0f), white},

			// three vertices clipped by X, Y and Z
			{tcu::Vec4( 0.0f, -1.2f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f,  0.5f,  -1.5f, 1.0f), white, tcu::Vec4( 1.2f, -0.9f,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largePolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( large, 0.5f, 0.0f,  1.0f), white, tcu::Vec4( 0.5f,  large,  0.0f,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, -large, 0.0f,  1.0f), white, tcu::Vec4(-1.1f, -large, 0.0f,  1.0f), white, tcu::Vec4(-0.9f,  large,  0.0f,  1.0f), white},
		};
		const TriangleCase::TriangleData largeDepthPolys[] =
		{
			// one vertex clipped
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), white, tcu::Vec4( 0.0f, -large, large,  1.0f), white},

			// two vertices clipped
			{tcu::Vec4( 0.5f, 0.5f,  0.0f,  1.0f), white, tcu::Vec4( 0.9f, large/2, -large,  1.0f), white, tcu::Vec4( large/4, 0.0f, -large,  1.0f), white},

			// three vertices clipped
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), white, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), white, tcu::Vec4(-0.2f, large/4, large,  1.0f), white},
		};
		const TriangleCase::TriangleData attribPolys[] =
		{
			// one vertex clipped to edge, large
			{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -large,  2.0f,  1.0f), blue},

			// two vertices clipped to edges
			{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

			// two vertices clipped to edges, with non-uniform w
			{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},

			// three vertices clipped, large, Z
			{tcu::Vec4(-0.9f, large/4, large,  1.0f), red, tcu::Vec4(-0.5f, -large/4, -large,  1.0f), yellow, tcu::Vec4(-0.2f, large/4, large,  1.0f), blue},
		};

		addChild(new TriangleCase(m_context, "poly_clip_viewport_center",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_clip_viewport_corner",			"polygon viewport clipping",	DE_ARRAY_BEGIN(viewportPolys),		DE_ARRAY_END(viewportPolys),	VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "poly_z_clip",							"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_center",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "poly_z_clip_viewport_corner",			"polygon z clipping",			DE_ARRAY_BEGIN(depthPolys),			DE_ARRAY_END(depthPolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_center",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_clip_viewport_corner",		"polygon viewport clipping",	DE_ARRAY_BEGIN(largePolys),			DE_ARRAY_END(largePolys),		VIEWPORT_CORNER));

		addChild(new TriangleCase(m_context, "large_poly_z_clip",					"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_WHOLE));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_center",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CENTER));
		addChild(new TriangleCase(m_context, "large_poly_z_clip_viewport_corner",	"polygon z clipping",			DE_ARRAY_BEGIN(largeDepthPolys),	DE_ARRAY_END(largeDepthPolys),	VIEWPORT_CORNER));

		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip",					"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_WHOLE));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CENTER));
		addChild(new TriangleAttributeCase(m_context, "poly_attrib_clip_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(attribPolys),		DE_ARRAY_END(attribPolys),		VIEWPORT_CORNER));
	}

	// multiple polygons
	{
		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to edge
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},

				// three vertices clipped, Z
				{tcu::Vec4(-0.9f, offset/4, offset,  1.0f), red, tcu::Vec4(-0.5f, -offset/4, -offset,  1.0f), yellow, tcu::Vec4(-0.2f, offset/4, offset,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_0",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_0_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges, with non-uniform w
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, 16.0f*tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_1",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_1_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_2",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_2_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset, -2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_3",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_3_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4( 0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4( offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_4",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_4_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.3f,  0.2f,  0.0f,  1.0f), red, tcu::Vec4(-0.3f, -0.2f,  0.0f,  1.0f), yellow, tcu::Vec4(-offset, 0.0f,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_5",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_5_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, 0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, offset,  2.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_6",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_6_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// two vertices clipped to edges
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},

				// two vertices clipped to edges
				{tcu::Vec4( 0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f, -0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4( 0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4( 1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f,  1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f,  0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f,  0.6f,  0.0f,  1.0f), blue},
				{tcu::Vec4(-0.6f, -1.2f,  0.0f,  1.0f), red, tcu::Vec4(-1.2f, -0.6f,  0.0f,  1.0f), yellow, tcu::Vec4(-0.6f, -0.6f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_7",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_7_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), blue,	tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_8",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_8_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,  tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_9",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_9_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white, tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,   tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_10",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_10_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}

		{
			const TriangleAttributeCase::TriangleData polys[] =
			{
				// one vertex clipped to z
				{tcu::Vec4(-0.2f,  -0.3f,  0.0f,  1.0f), red, tcu::Vec4( 0.2f, -0.3f,  0.0f,  1.0f), yellow, tcu::Vec4( 0.0f, -offset,  2.0f,  1.0f), blue},

				// fill
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), white,  tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), white},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), red,    tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), red,    tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), red},
				{tcu::Vec4( -1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), blue,   tcu::Vec4( -1.0f, 1.0f,  0.0f,  1.0f), blue},
				{tcu::Vec4( -1.0f,  1.0f,  0.0f,  1.0f), yellow, tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f), yellow, tcu::Vec4(  1.0f, 1.0f,  0.0f,  1.0f), yellow},
			};

			addChild(new TriangleAttributeCase(m_context, "multiple_11",					"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_WHOLE));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_center",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CENTER));
			addChild(new TriangleAttributeCase(m_context, "multiple_11_viewport_corner",	"polygon clipping",		DE_ARRAY_BEGIN(polys),		DE_ARRAY_END(polys),		VIEWPORT_CORNER));
		}
	}
}